

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  bool bVar1;
  U32 UVar2;
  int iVar3;
  uint uVar4;
  ZSTD_nextInputType_e ZVar5;
  char *src;
  char *pcVar6;
  void *pvVar7;
  void *pvVar8;
  ulong __n;
  char *pcVar9;
  ulong uVar10;
  size_t sVar11;
  size_t sVar12;
  ulong local_148;
  size_t local_140;
  uint local_124;
  unsigned_long_long local_120;
  size_t local_118;
  size_t nextSrcSizeHint;
  size_t flushedSize;
  size_t toFlushSize;
  size_t decodedSize_1;
  size_t loadedSize;
  int isSkipFrame_1;
  size_t toLoad_1;
  size_t neededInSize_1;
  size_t decodedSize;
  int isSkipFrame;
  size_t neededInSize;
  size_t bufferSize;
  size_t neededOutBuffSize;
  size_t neededInBuffSize;
  size_t errcod_1;
  size_t errcod;
  size_t decompressedSize;
  size_t cSize;
  size_t remainingInput;
  size_t toLoad;
  size_t hSize;
  void *pvStack_58;
  U32 someMoreWork;
  char *op;
  char *oend;
  char *ostart;
  char *ip;
  char *iend;
  char *istart;
  ZSTD_inBuffer *input_local;
  ZSTD_outBuffer *output_local;
  ZSTD_DStream *zds_local;
  
  src = (char *)((long)input->src + input->pos);
  pcVar6 = (char *)((long)input->src + input->size);
  pvVar7 = (void *)((long)output->dst + output->pos);
  pvVar8 = (void *)((long)output->dst + output->size);
  bVar1 = true;
  if (input->size < input->pos) {
    zds_local = (ZSTD_DStream *)0xffffffffffffffb8;
  }
  else {
    pvStack_58 = pvVar7;
    ostart = src;
    if (output->size < output->pos) {
      zds_local = (ZSTD_DStream *)0xffffffffffffffba;
    }
    else {
LAB_0082e6ba:
      if (bVar1) {
        switch(zds->streamStage) {
        case zdss_init:
          goto switchD_0082e6f4_caseD_0;
        case zdss_loadHeader:
          goto switchD_0082e6f4_caseD_1;
        case zdss_read:
          goto switchD_0082e6f4_caseD_2;
        case zdss_load:
          goto switchD_0082e6f4_caseD_3;
        case zdss_flush:
          goto switchD_0082e6f4_caseD_4;
        default:
          return 0xffffffffffffffff;
        }
      }
      input->pos = (long)ostart - (long)input->src;
      output->pos = (long)pvStack_58 - (long)output->dst;
      if ((ostart == src) && (pvStack_58 == pvVar7)) {
        zds->noForwardProgress = zds->noForwardProgress + 1;
        if (0xf < zds->noForwardProgress) {
          if (pvStack_58 == pvVar8) {
            return 0xffffffffffffffba;
          }
          if (ostart == pcVar6) {
            return 0xffffffffffffffb8;
          }
        }
      }
      else {
        zds->noForwardProgress = 0;
      }
      sVar12 = ZSTD_nextSrcSizeToDecompress(zds);
      if (sVar12 == 0) {
        if (zds->outEnd == zds->outStart) {
          if (zds->hostageByte != 0) {
            if (input->size <= input->pos) {
              zds->streamStage = zdss_read;
              return 1;
            }
            input->pos = input->pos + 1;
          }
          zds_local = (ZSTD_DStream *)0x0;
        }
        else {
          if (zds->hostageByte == 0) {
            input->pos = input->pos - 1;
            zds->hostageByte = 1;
          }
          zds_local = (ZSTD_DStream *)0x1;
        }
      }
      else {
        ZVar5 = ZSTD_nextInputType(zds);
        zds_local = (ZSTD_DStream *)
                    (((long)(int)(uint)(ZVar5 == ZSTDnit_block) * 3 + sVar12) - zds->inPos);
      }
    }
  }
  return (size_t)zds_local;
switchD_0082e6f4_caseD_0:
  ZSTD_resetDStream(zds);
switchD_0082e6f4_caseD_1:
  local_118 = ZSTD_getFrameHeader_advanced(&zds->fParams,zds->headerBuffer,zds->lhSize,zds->format);
  uVar4 = ERR_isError(local_118);
  if (uVar4 != 0) {
    return local_118;
  }
  if (local_118 == 0) {
    if (((((zds->fParams).frameContentSize == 0) || ((zds->fParams).windowSize == 0)) ||
        ((ulong)((long)pvVar8 - (long)pvStack_58) < (zds->fParams).frameContentSize)) ||
       (sVar12 = ZSTD_findFrameCompressedSize(src,(long)pcVar6 - (long)src),
       (ulong)((long)pcVar6 - (long)src) < sVar12)) {
      sVar12 = ZSTD_decompressBegin_usingDDict(zds,zds->ddict);
      uVar4 = ERR_isError(sVar12);
      if (uVar4 != 0) {
        return sVar12;
      }
      UVar2 = MEM_readLE32(zds->headerBuffer);
      if ((UVar2 & 0xfffffff0) == 0x184d2a50) {
        UVar2 = MEM_readLE32(zds->headerBuffer + 4);
        zds->expected = (ulong)UVar2;
        zds->stage = ZSTDds_skipFrame;
      }
      else {
        sVar12 = ZSTD_decodeFrameHeader(zds,zds->headerBuffer,zds->lhSize);
        uVar4 = ERR_isError(sVar12);
        if (uVar4 != 0) {
          return sVar12;
        }
        zds->expected = 3;
        zds->stage = ZSTDds_decodeBlockHeader;
      }
      if ((zds->fParams).windowSize < 0x401) {
        local_120 = 0x400;
      }
      else {
        local_120 = (zds->fParams).windowSize;
      }
      (zds->fParams).windowSize = local_120;
      if (zds->maxWindowSize < (zds->fParams).windowSize) {
        return 0xfffffffffffffff0;
      }
      if ((zds->fParams).blockSizeMax < 5) {
        local_124 = 4;
      }
      else {
        local_124 = (zds->fParams).blockSizeMax;
      }
      uVar10 = (ulong)local_124;
      sVar12 = ZSTD_decodingBufferSize_min
                         ((zds->fParams).windowSize,(zds->fParams).frameContentSize);
      if ((zds->inBuffSize < uVar10) || (zds->outBuffSize < sVar12)) {
        if (zds->staticSize == 0) {
          ZSTD_free(zds->inBuff,zds->customMem);
          zds->inBuffSize = 0;
          zds->outBuffSize = 0;
          pcVar9 = (char *)ZSTD_malloc(uVar10 + sVar12,zds->customMem);
          zds->inBuff = pcVar9;
          if (zds->inBuff == (char *)0x0) {
            return 0xffffffffffffffc0;
          }
        }
        else if (zds->staticSize - 0x271f8 < uVar10 + sVar12) {
          return 0xffffffffffffffc0;
        }
        zds->inBuffSize = uVar10;
        zds->outBuff = zds->inBuff + zds->inBuffSize;
        zds->outBuffSize = sVar12;
      }
      zds->streamStage = zdss_read;
switchD_0082e6f4_caseD_2:
      sVar12 = ZSTD_nextSrcSizeToDecompress(zds);
      if (sVar12 == 0) {
        zds->streamStage = zdss_init;
        bVar1 = false;
      }
      else if ((ulong)((long)pcVar6 - (long)ostart) < sVar12) {
        if (ostart == pcVar6) {
          bVar1 = false;
        }
        else {
          zds->streamStage = zdss_load;
switchD_0082e6f4_caseD_3:
          sVar12 = ZSTD_nextSrcSizeToDecompress(zds);
          uVar10 = sVar12 - zds->inPos;
          iVar3 = ZSTD_isSkipFrame(zds);
          if (iVar3 == 0) {
            if (zds->inBuffSize - zds->inPos < uVar10) {
              return 0xffffffffffffffec;
            }
            decodedSize_1 =
                 ZSTD_limitCopy(zds->inBuff + zds->inPos,uVar10,ostart,(long)pcVar6 - (long)ostart);
          }
          else {
            local_148 = uVar10;
            if ((ulong)((long)pcVar6 - (long)ostart) <= uVar10) {
              local_148 = (long)pcVar6 - (long)ostart;
            }
            decodedSize_1 = local_148;
          }
          ostart = ostart + decodedSize_1;
          zds->inPos = decodedSize_1 + zds->inPos;
          if (decodedSize_1 < uVar10) {
            bVar1 = false;
          }
          else {
            sVar12 = ZSTD_decompressContinue
                               (zds,zds->outBuff + zds->outStart,zds->outBuffSize - zds->outStart,
                                zds->inBuff,sVar12);
            uVar4 = ERR_isError(sVar12);
            if (uVar4 != 0) {
              return sVar12;
            }
            zds->inPos = 0;
            if ((sVar12 == 0) && (iVar3 == 0)) {
              zds->streamStage = zdss_read;
            }
            else {
              zds->outEnd = sVar12 + zds->outStart;
              zds->streamStage = zdss_flush;
switchD_0082e6f4_caseD_4:
              sVar12 = zds->outEnd - zds->outStart;
              sVar11 = ZSTD_limitCopy(pvStack_58,(long)pvVar8 - (long)pvStack_58,
                                      zds->outBuff + zds->outStart,sVar12);
              pvStack_58 = (void *)(sVar11 + (long)pvStack_58);
              zds->outStart = sVar11 + zds->outStart;
              if (sVar11 == sVar12) {
                zds->streamStage = zdss_read;
                if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
                   (zds->outBuffSize < zds->outStart + (ulong)(zds->fParams).blockSizeMax)) {
                  zds->outEnd = 0;
                  zds->outStart = 0;
                }
              }
              else {
                bVar1 = false;
              }
            }
          }
        }
      }
      else {
        iVar3 = ZSTD_isSkipFrame(zds);
        if (iVar3 == 0) {
          local_140 = zds->outBuffSize - zds->outStart;
        }
        else {
          local_140 = 0;
        }
        sVar11 = ZSTD_decompressContinue(zds,zds->outBuff + zds->outStart,local_140,ostart,sVar12);
        uVar4 = ERR_isError(sVar11);
        if (uVar4 != 0) {
          return sVar11;
        }
        ostart = ostart + sVar12;
        if ((sVar11 != 0) || (iVar3 != 0)) {
          zds->outEnd = sVar11 + zds->outStart;
          zds->streamStage = zdss_flush;
        }
      }
    }
    else {
      sVar11 = ZSTD_decompress_usingDDict
                         (zds,pvStack_58,(long)pvVar8 - (long)pvStack_58,src,sVar12,zds->ddict);
      uVar4 = ERR_isError(sVar11);
      if (uVar4 != 0) {
        return sVar11;
      }
      ostart = src + sVar12;
      pvStack_58 = (void *)((long)pvStack_58 + sVar11);
      zds->expected = 0;
      zds->streamStage = zdss_init;
      bVar1 = false;
    }
  }
  else {
    uVar10 = local_118 - zds->lhSize;
    __n = (long)pcVar6 - (long)ostart;
    if (__n < uVar10) {
      if (__n != 0) {
        memcpy(zds->headerBuffer + zds->lhSize,ostart,__n);
        zds->lhSize = __n + zds->lhSize;
      }
      input->pos = input->size;
      if (local_118 < 6) {
        local_118 = 6;
      }
      return local_118 + (3 - zds->lhSize);
    }
    memcpy(zds->headerBuffer + zds->lhSize,ostart,uVar10);
    zds->lhSize = local_118;
    ostart = ostart + uVar10;
  }
  goto LAB_0082e6ba;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const istart = (const char*)(input->src) + input->pos;
    const char* const iend = (const char*)(input->src) + input->size;
    const char* ip = istart;
    char* const ostart = (char*)(output->dst) + output->pos;
    char* const oend = (char*)(output->dst) + output->size;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    if (input->pos > input->size) {  /* forbidden */
        DEBUGLOG(5, "in: pos: %u   vs size: %u",
                    (U32)input->pos, (U32)input->size);
        return ERROR(srcSize_wrong);
    }
    if (output->pos > output->size) {  /* forbidden */
        DEBUGLOG(5, "out: pos: %u   vs size: %u",
                    (U32)output->pos, (U32)output->size);
        return ERROR(dstSize_tooSmall);
    }
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            ZSTD_resetDStream(zds);   /* transparent reset on starting decoding a new frame */
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                /* legacy support is incompatible with static dctx */
                if (zds->staticSize) return ERROR(memory_allocation);
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        const void* const dict = zds->ddict ? ZSTD_DDict_dictContent(zds->ddict) : NULL;
                        size_t const dictSize = zds->ddict ? ZSTD_DDict_dictSize(zds->ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        /* legacy support is incompatible with static dctx */
                        if (zds->staticSize) return ERROR(memory_allocation);
                        CHECK_F(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize));
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX(ZSTD_FRAMEHEADERSIZE_MIN, hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize && zds->fParams.windowSize /* skippable frame if == 0 */
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, iend-istart);
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, oend-op, istart, cSize, zds->ddict);
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            CHECK_F(ZSTD_decompressBegin_usingDDict(zds, zds->ddict));

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                CHECK_F(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize));
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            if (zds->fParams.windowSize > zds->maxWindowSize) return ERROR(frameParameter_windowTooLarge);

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize);
                if ((zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize)) {
                    size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                    DEBUGLOG(4, "inBuff  : from %u to %u",
                                (U32)zds->inBuffSize, (U32)neededInBuffSize);
                    DEBUGLOG(4, "outBuff : from %u to %u",
                                (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                    if (zds->staticSize) {  /* static DCtx */
                        DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                        assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                        if (bufferSize > zds->staticSize - sizeof(ZSTD_DCtx))
                            return ERROR(memory_allocation);
                    } else {
                        ZSTD_free(zds->inBuff, zds->customMem);
                        zds->inBuffSize = 0;
                        zds->outBuffSize = 0;
                        zds->inBuff = (char*)ZSTD_malloc(bufferSize, zds->customMem);
                        if (zds->inBuff == NULL) return ERROR(memory_allocation);
                    }
                    zds->inBuffSize = neededInBuffSize;
                    zds->outBuff = zds->inBuff + zds->inBuffSize;
                    zds->outBuffSize = neededOutBuffSize;
            }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    int const isSkipFrame = ZSTD_isSkipFrame(zds);
                    size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, (isSkipFrame ? 0 : zds->outBuffSize - zds->outStart),
                        ip, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    ip += neededInSize;
                    if (!decodedSize && !isSkipFrame) break;   /* this was just a header */
                    zds->outEnd = zds->outStart + decodedSize;
                    zds->streamStage = zdss_flush;
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    if (toLoad > zds->inBuffSize - zds->inPos) return ERROR(corruption_detected);   /* should never happen */
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, iend-ip);
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                {   size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, zds->outBuffSize - zds->outStart,
                        zds->inBuff, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    zds->inPos = 0;   /* input is consumed */
                    if (!decodedSize && !isSkipFrame) { zds->streamStage = zdss_read; break; }   /* this was just a header */
                    zds->outEnd = zds->outStart +  decodedSize;
            }   }
            zds->streamStage = zdss_flush;
            /* fall-through */

        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, oend-op, zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            return ERROR(GENERIC);   /* some compiler require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));
    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            if (op==oend) return ERROR(dstSize_tooSmall);
            if (ip==iend) return ERROR(srcSize_wrong);
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}